

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O2

void __thiscall
Lib::DArray<int>::initFromIterator<Lib::IterTraits<Lib::RangeIterator<int>>>
          (DArray<int> *this,IterTraits<Lib::RangeIterator<int>_> it,size_t count)

{
  int *piVar1;
  ulong uVar2;
  size_t s;
  int iVar3;
  
  uVar2 = it._iter._0_8_;
  if (count == 0) {
    ensure(this,0);
    s = 1;
    while (iVar3 = (int)uVar2, iVar3 < it._iter._to) {
      expand(this,s);
      this->_array[s - 1] = iVar3;
      s = s + 1;
      uVar2 = (ulong)(iVar3 + 1);
    }
  }
  else {
    ensure(this,count);
    piVar1 = this->_array;
    while (iVar3 = (int)uVar2, iVar3 < it._iter._to) {
      *piVar1 = iVar3;
      piVar1 = piVar1 + 1;
      uVar2 = (ulong)(iVar3 + 1);
    }
  }
  return;
}

Assistant:

void initFromIterator(It it, size_t count=0) {
    if(count) {
      ensure(count);
      C* ptr=_array;
      while(it.hasNext()) {
	*(ptr++)=it.next();
      }
    } else {
      ensure(0);
      count=0;
      while(it.hasNext()) {
	expand(++count);
	(*this)[count-1]=it.next();
      }
    }
  }